

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.h
# Opt level: O0

void __thiscall vm_val_t::num_to_logical(vm_val_t *this)

{
  int iVar1;
  int *in_RDI;
  
  if (*in_RDI == 7) {
    iVar1 = 2;
    if (in_RDI[2] == 0) {
      iVar1 = 1;
    }
    *in_RDI = iVar1;
    return;
  }
  err_throw(0);
}

Assistant:

void num_to_logical()
    {
        /* check the type */
        if (typ == VM_INT)
        {
            /* it's an integer - treat 0 as nil, all else as true */
            typ = (val.intval == 0 ? VM_NIL : VM_TRUE);
        }
        else
        {
            /* it's not a number - throw an error */
            err_throw(VMERR_NO_LOG_CONV);
        }
    }